

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O3

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CNegativeExpression *exp)

{
  IExpression *pIVar1;
  
  std::__cxx11::string::append((char *)&this->code);
  pIVar1 = (exp->expression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  std::__cxx11::string::append((char *)&this->code);
  return;
}

Assistant:

void CConvertVisitor::Visit(CNegativeExpression &exp) {
	this->code += "!(";
	if (exp.expression) {
		exp.expression->Accept(*this);
	}
	this->code += ")";
}